

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pTextureCases.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Performance::Texture2DRenderCase::init(Texture2DRenderCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *pppTVar1;
  ostringstream *poVar2;
  int iVar3;
  int iVar4;
  TestLog *pTVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  DataType dataType;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Mat3 *pMVar10;
  char *pcVar11;
  size_t sVar12;
  ostream *poVar13;
  Texture2D *pTVar14;
  int row;
  int col_3;
  long lVar15;
  Mat3 *pMVar16;
  Texture2DRenderCase *this_00;
  uint uVar17;
  ulong uVar18;
  Mat3 *pMVar19;
  iterator __position;
  long lVar20;
  ulong uVar21;
  float v;
  float fVar22;
  float v_1;
  float v_2;
  float v_3;
  Texture2D *texture;
  ostringstream fragSrc;
  TextureFormatInfo fmtInfo;
  TextureFormat texFormat;
  undefined1 auStack_298 [4];
  uint local_294;
  ulong local_290;
  uint local_284;
  Texture2DRenderCase *local_280;
  undefined1 local_278 [8];
  undefined8 uStack_270;
  long local_268 [2];
  uint local_254;
  undefined1 local_250 [8];
  undefined8 uStack_248;
  Vec4 local_240;
  vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *local_230;
  Vector<float,_2> local_228;
  Vector<float,_2> local_220;
  Vector<float,_2> local_218;
  Vector<float,_2> local_210;
  undefined1 local_208 [112];
  ios_base local_198 [8];
  ios_base local_190 [264];
  TextureFormatInfo local_88;
  TextureFormat local_48;
  pointer local_40;
  float afStack_38 [2];
  
  pTVar5 = ((this->super_ShaderPerformanceCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_48 = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo(&local_88,&local_48);
  local_290._0_4_ =
       (Precision)
       (local_48.type == SIGNED_INT32 || (local_48.type & ~SNORM_INT32) == UNSIGNED_INT32);
  dataType = glu::getSampler2DType(local_48);
  iVar9 = (*((this->super_ShaderPerformanceCase).m_renderCtx)->_vptr_RenderContext[4])();
  uVar17 = *(uint *)CONCAT44(extraout_var,iVar9);
  iVar9 = (*((this->super_ShaderPerformanceCase).m_renderCtx)->_vptr_RenderContext[4])();
  local_284 = *(uint *)(CONCAT44(extraout_var_00,iVar9) + 4);
  if (this->m_powerOfTwo == true) {
    iVar9 = 0x1f;
    if (uVar17 != 0) {
      for (; uVar17 >> iVar9 == 0; iVar9 = iVar9 + -1) {
      }
    }
    iVar6 = 0x1f;
    if (local_284 != 0) {
      for (; local_284 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    uVar17 = uVar17 & -(0x80000000U >> (~(byte)iVar9 & 0x1f));
    local_284 = local_284 & -(0x80000000U >> (~(byte)iVar6 & 0x1f));
  }
  local_290 = CONCAT44(local_290._4_4_,(Precision)local_290 + 1);
  local_254 = this->m_minFilter & 0xfffffffc;
  pMVar10 = &this->m_coordTransform;
  lVar15 = 0;
  local_278 = (undefined1  [8])0x0;
  uStack_270._0_4_ = 1.0;
  local_208._0_8_ = (pointer)0x0;
  pMVar16 = pMVar10;
  do {
    fVar22 = 0.0;
    lVar20 = 0;
    pMVar19 = pMVar16;
    do {
      fVar22 = fVar22 + (pMVar19->m_data).m_data[0].m_data[0] * *(float *)(local_278 + lVar20 * 4);
      lVar20 = lVar20 + 1;
      pMVar19 = (Mat3 *)((pMVar19->m_data).m_data + 1);
    } while (lVar20 != 3);
    *(float *)(local_208 + lVar15 * 4) = fVar22;
    uVar7 = local_208._0_8_;
    lVar15 = lVar15 + 1;
    pMVar16 = (Mat3 *)((pMVar16->m_data).m_data[0].m_data + 1);
  } while (lVar15 != 3);
  local_210.m_data[0] = (float)local_208._0_4_;
  local_210.m_data[1] = (float)local_208._4_4_;
  local_278 = (undefined1  [8])0x3f800000;
  uStack_270._0_4_ = 1.0;
  local_208._0_8_ = (pointer)0x0;
  lVar15 = 0;
  pMVar16 = pMVar10;
  do {
    fVar22 = 0.0;
    lVar20 = 0;
    pMVar19 = pMVar16;
    do {
      fVar22 = fVar22 + (pMVar19->m_data).m_data[0].m_data[0] * *(float *)(local_278 + lVar20 * 4);
      lVar20 = lVar20 + 1;
      pMVar19 = (Mat3 *)((pMVar19->m_data).m_data + 1);
    } while (lVar20 != 3);
    *(float *)(local_208 + lVar15 * 4) = fVar22;
    local_250 = (undefined1  [8])local_208._0_8_;
    lVar15 = lVar15 + 1;
    pMVar16 = (Mat3 *)((pMVar16->m_data).m_data[0].m_data + 1);
  } while (lVar15 != 3);
  local_218.m_data[0] = (float)local_208._0_4_;
  local_218.m_data[1] = (float)local_208._4_4_;
  local_278 = (undefined1  [8])0x3f80000000000000;
  uStack_270._0_4_ = 1.0;
  local_208._0_8_ = (Texture2D *)0x0;
  lVar15 = 0;
  pMVar16 = pMVar10;
  do {
    fVar22 = 0.0;
    lVar20 = 0;
    pMVar19 = pMVar16;
    do {
      fVar22 = fVar22 + (pMVar19->m_data).m_data[0].m_data[0] * *(float *)(local_278 + lVar20 * 4);
      lVar20 = lVar20 + 1;
      pMVar19 = (Mat3 *)((pMVar19->m_data).m_data + 1);
    } while (lVar20 != 3);
    *(float *)(local_208 + lVar15 * 4) = fVar22;
    uVar8 = local_208._0_8_;
    lVar15 = lVar15 + 1;
    pMVar16 = (Mat3 *)((pMVar16->m_data).m_data[0].m_data + 1);
  } while (lVar15 != 3);
  local_220.m_data[0] = (float)local_208._0_4_;
  local_220.m_data[1] = (float)local_208._4_4_;
  local_278 = (undefined1  [8])0x3f8000003f800000;
  uStack_270._0_4_ = 1.0;
  local_208._0_8_ = (pointer)0x0;
  local_208._8_4_ = 0;
  lVar15 = 0;
  do {
    fVar22 = 0.0;
    lVar20 = 0;
    pMVar16 = pMVar10;
    do {
      fVar22 = fVar22 + (pMVar16->m_data).m_data[0].m_data[0] * *(float *)(local_278 + lVar20 * 4);
      lVar20 = lVar20 + 1;
      pMVar16 = (Mat3 *)((pMVar16->m_data).m_data + 1);
    } while (lVar20 != 3);
    *(float *)(local_208 + lVar15 * 4) = fVar22;
    local_40 = (pointer)local_208._0_8_;
    lVar15 = lVar15 + 1;
    pMVar10 = (Mat3 *)((pMVar10->m_data).m_data[0].m_data + 1);
  } while (lVar15 != 3);
  local_228.m_data[0] = (float)local_208._0_4_;
  local_228.m_data[1] = (float)local_208._4_4_;
  local_278 = (undefined1  [8])uVar7;
  uStack_270._0_4_ = 0.0;
  uStack_270._4_4_ = 0.0;
  uStack_248._0_4_ = 0.0;
  uStack_248._4_4_ = 0.0;
  local_208._0_4_ = (undefined4)uVar8;
  local_208._4_4_ = SUB84(uVar8,4);
  local_240.m_data[0] = (float)local_208._0_4_;
  local_240.m_data[1] = (float)local_208._4_4_;
  local_240.m_data[2] = 0.0;
  local_240.m_data[3] = 0.0;
  afStack_38[0] = 0.0;
  afStack_38[1] = 0.0;
  local_294 = uVar17;
  local_208._0_8_ = local_40;
  deqp::gls::AttribSpec::AttribSpec
            ((AttribSpec *)local_208,"a_coords",(Vec4 *)local_278,(Vec4 *)local_250,&local_240,
             (Vec4 *)&local_40);
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
  emplace_back<deqp::gls::AttribSpec>
            (&(this->super_ShaderPerformanceCase).m_attributes,(AttribSpec *)local_208);
  if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
    operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
  }
  poVar2 = (ostringstream *)(local_208 + 8);
  local_208._0_8_ = pTVar5;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Size: ",6);
  std::ostream::operator<<(poVar2,local_294);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"x",1);
  std::ostream::operator<<(poVar2,local_284);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_190);
  local_208._0_8_ = pTVar5;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Format: ",8);
  pcVar11 = glu::getTextureFormatName(this->m_internalFormat);
  if (pcVar11 == (char *)0x0) {
    std::ios::clear((int)poVar2 +
                    (int)*(undefined8 *)(CONCAT44(local_208._12_4_,local_208._8_4_) + -0x18));
  }
  else {
    sVar12 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,pcVar11,sVar12);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_190);
  poVar2 = (ostringstream *)(local_208 + 8);
  local_208._0_8_ = pTVar5;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Coords: ",8);
  tcu::operator<<((ostream *)poVar2,&local_210);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
  tcu::operator<<((ostream *)poVar2,&local_218);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
  tcu::operator<<((ostream *)poVar2,&local_220);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
  tcu::operator<<((ostream *)poVar2,&local_228);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_190);
  poVar2 = (ostringstream *)(local_208 + 8);
  local_208._0_8_ = pTVar5;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Wrap: ",6);
  local_278 = (undefined1  [8])glu::getTextureWrapModeName;
  local_280 = this;
  uStack_270._0_4_ = (float)this->m_wrapS;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_278,(ostream *)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," / ",3);
  local_250 = (undefined1  [8])glu::getTextureWrapModeName;
  uStack_248._0_4_ = (float)local_280->m_wrapT;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_250,(ostream *)poVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_190);
  poVar2 = (ostringstream *)(local_208 + 8);
  local_208._0_8_ = pTVar5;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Filter: ",8);
  local_278 = (undefined1  [8])glu::getTextureFilterName;
  uStack_270._0_4_ = (float)local_280->m_minFilter;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_278,(ostream *)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," / ",3);
  local_250 = (undefined1  [8])glu::getTextureFilterName;
  uStack_248._0_4_ = (float)local_280->m_magFilter;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_250,(ostream *)poVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_190);
  poVar2 = (ostringstream *)(local_208 + 8);
  local_208._0_8_ = pTVar5;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Mipmaps: ",9);
  pcVar11 = "false";
  if (local_254 == 0x2700) {
    pcVar11 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,pcVar11,(ulong)(local_254 == 0x2700) ^ 5);
  this_00 = local_280;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_190);
  poVar2 = (ostringstream *)(local_208 + 8);
  local_208._0_8_ = pTVar5;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Using additive blending.",0x18);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_190);
  deqp::gls::ShaderPerformanceCase::setViewportSize
            (&this_00->super_ShaderPerformanceCase,local_294,local_284);
  std::__cxx11::string::_M_replace
            ((ulong)&(this_00->super_ShaderPerformanceCase).m_vertShaderSource,0,
             (char *)(this_00->super_ShaderPerformanceCase).m_vertShaderSource._M_string_length,
             0xb3b7ba);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_208,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_208,"in mediump vec2 v_coords;\n",0x1a);
  if (0 < this_00->m_numTextures) {
    iVar9 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"uniform ",8);
      pcVar11 = glu::getPrecisionName((Precision)local_290);
      if (pcVar11 == (char *)0x0) {
        std::ios::clear((int)auStack_298 + (int)((TestLog *)(local_208._0_8_ + -0x18))->m_log + 0x90
                       );
      }
      else {
        sVar12 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar11,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," ",1);
      pcVar11 = glu::getDataTypeName(dataType);
      if (pcVar11 == (char *)0x0) {
        std::ios::clear((int)auStack_298 + (int)((TestLog *)(local_208._0_8_ + -0x18))->m_log + 0x90
                       );
      }
      else {
        sVar12 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar11,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," u_sampler",10);
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)local_208,iVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,";\n",2);
      iVar9 = iVar9 + 1;
    } while (iVar9 < this_00->m_numTextures);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"{\n",2);
  if (0 < this_00->m_numTextures) {
    iVar9 = 0;
    do {
      lVar15 = 6;
      pcVar11 = "\tr += ";
      if (iVar9 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"\t",1);
        pcVar11 = glu::getPrecisionName((Precision)local_290);
        if (pcVar11 == (char *)0x0) {
          lVar15 = 10;
          std::ios::clear((int)auStack_298 + (int)((TestLog *)(local_208._0_8_ + -0x18))->m_log +
                          0x90);
          pcVar11 = " vec4 r = ";
        }
        else {
          sVar12 = strlen(pcVar11);
          lVar15 = 10;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar11,sVar12);
          pcVar11 = " vec4 r = ";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar11,lVar15);
      if ((dataType == TYPE_UINT_SAMPLER_2D) || (dataType == TYPE_INT_SAMPLER_2D)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"vec4(",5);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"texture(u_sampler",0x11);
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)local_208,iVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,", v_coords)",0xb);
      if ((dataType == TYPE_UINT_SAMPLER_2D) || (dataType == TYPE_INT_SAMPLER_2D)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,")",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,";\n",2);
      iVar9 = iVar9 + 1;
    } while (iVar9 < this_00->m_numTextures);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"\to_color = r;\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this_00->super_ShaderPerformanceCase).m_fragShaderSource,
             (string *)local_278);
  if (local_278 != (undefined1  [8])local_268) {
    operator_delete((void *)local_278,local_268[0] + 1);
  }
  pTVar14 = (Texture2D *)&this_00->m_textures;
  __position._M_current = (Texture2D **)(long)this_00->m_numTextures;
  local_230 = (vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)pTVar14;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve
            ((vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *)pTVar14,
             (size_type)__position._M_current);
  if (0 < this_00->m_numTextures) {
    local_290 = 0;
    do {
      uVar17 = local_294;
      if (init()::swizzles == '\0') {
        init((EVP_PKEY_CTX *)pTVar14);
      }
      pTVar14 = (Texture2D *)operator_new(0x70);
      glu::Texture2D::Texture2D
                (pTVar14,(this_00->super_ShaderPerformanceCase).m_renderCtx,
                 this_00->m_internalFormat,uVar17,local_284);
      __position._M_current =
           (this_00->m_textures).
           super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_240.m_data._0_8_ = pTVar14;
      if (__position._M_current ==
          (this_00->m_textures).
          super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::
        _M_realloc_insert<glu::Texture2D*const&>(local_230,__position,(Texture2D **)&local_240);
      }
      else {
        *__position._M_current = pTVar14;
        pppTVar1 = &(this_00->m_textures).
                    super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      uVar17 = 1;
      if ((local_254 != 0x2700) ||
         (uVar17 = (int)((long)(((Texture2D *)(local_240.m_data._0_8_ + 0x18))->
                               super_TextureLevelPyramid).m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(((Texture2D *)(local_240.m_data._0_8_ + 0x18))->
                               super_TextureLevelPyramid).m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333,
         0 < (int)uVar17)) {
        uVar21 = (ulong)(((uint)local_290 & 7) << 4);
        lVar15 = 0;
        uVar18 = 0;
        do {
          tcu::Texture2D::allocLevel((Texture2D *)(local_240.m_data._0_8_ + 0x18),(int)uVar18);
          iVar9 = *(int *)((long)init::swizzles[0].m_data + uVar21);
          iVar6 = *(int *)((long)init::swizzles[0].m_data + uVar21 + 4);
          iVar3 = *(int *)((long)init::swizzles[0].m_data + uVar21 + 8);
          iVar4 = *(int *)((long)init::swizzles[0].m_data + uVar21 + 0xc);
          local_278._4_4_ = local_88.valueMin.m_data[iVar6];
          local_278._0_4_ = local_88.valueMin.m_data[iVar9];
          uStack_270._4_4_ = local_88.valueMin.m_data[iVar4];
          uStack_270._0_4_ = local_88.valueMin.m_data[iVar3];
          local_250._4_4_ = local_88.valueMax.m_data[iVar6];
          local_250._0_4_ = local_88.valueMax.m_data[iVar9];
          uStack_248._4_4_ = local_88.valueMax.m_data[iVar4];
          uStack_248._0_4_ = local_88.valueMax.m_data[iVar3];
          __position._M_current = (Texture2D **)local_278;
          tcu::fillWithComponentGradients
                    ((PixelBufferAccess *)
                     ((long)(((((Texture2D *)(local_240.m_data._0_8_ + 0x18))->
                              super_TextureLevelPyramid).m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_ConstPixelBufferAccess).m_size.m_data + lVar15 + -8),
                     (Vec4 *)local_278,(Vec4 *)local_250);
          uVar18 = uVar18 + 1;
          lVar15 = lVar15 + 0x28;
        } while (uVar17 != uVar18);
      }
      pTVar14 = (Texture2D *)local_240.m_data._0_8_;
      (*(*(_func_int ***)local_240.m_data._0_8_)[2])();
      uVar17 = (int)local_290 + 1;
      local_290 = (ulong)uVar17;
      this_00 = local_280;
    } while ((int)uVar17 < local_280->m_numTextures);
  }
  deqp::gls::ShaderPerformanceCase::init
            (&this_00->super_ShaderPerformanceCase,(EVP_PKEY_CTX *)__position._M_current);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
  iVar9 = std::ios_base::~ios_base(local_198);
  return iVar9;
}

Assistant:

void Texture2DRenderCase::init (void)
{
	TestLog& log = m_testCtx.getLog();

	const tcu::TextureFormat		texFormat	= glu::mapGLInternalFormat(m_internalFormat);
	const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFormat);
	const glu::Precision			samplerPrec	= (texFormat.type == tcu::TextureFormat::FLOAT			||
												   texFormat.type == tcu::TextureFormat::UNSIGNED_INT32	||
												   texFormat.type == tcu::TextureFormat::SIGNED_INT32)
												? glu::PRECISION_HIGHP : glu::PRECISION_MEDIUMP;
	const glu::DataType				samplerType	= glu::getSampler2DType(texFormat);
	const bool						isIntUint	= samplerType == glu::TYPE_INT_SAMPLER_2D || samplerType == glu::TYPE_UINT_SAMPLER_2D;

	int								width		= m_renderCtx.getRenderTarget().getWidth();
	int								height		= m_renderCtx.getRenderTarget().getHeight();

	if (m_powerOfTwo)
	{
		width	= roundDownToPowerOfTwo(width);
		height	= roundDownToPowerOfTwo(height);
	}

	bool mipmaps = m_minFilter == GL_NEAREST_MIPMAP_NEAREST ||
				   m_minFilter == GL_NEAREST_MIPMAP_LINEAR	||
				   m_minFilter == GL_LINEAR_MIPMAP_NEAREST	||
				   m_minFilter == GL_LINEAR_MIPMAP_LINEAR;

	DE_ASSERT(m_powerOfTwo || (!mipmaps && m_wrapS == GL_CLAMP_TO_EDGE && m_wrapT == GL_CLAMP_TO_EDGE));

	Vec2 p00 = (m_coordTransform * Vec3(0.0f, 0.0f, 1.0f)).swizzle(0,1);
	Vec2 p10 = (m_coordTransform * Vec3(1.0f, 0.0f, 1.0f)).swizzle(0,1);
	Vec2 p01 = (m_coordTransform * Vec3(0.0f, 1.0f, 1.0f)).swizzle(0,1);
	Vec2 p11 = (m_coordTransform * Vec3(1.0f, 1.0f, 1.0f)).swizzle(0,1);

	m_attributes.push_back(AttribSpec("a_coords", Vec4(p00.x(), p00.y(), 0.0f, 0.0f),
												  Vec4(p10.x(), p10.y(), 0.0f, 0.0f),
												  Vec4(p01.x(), p01.y(), 0.0f, 0.0f),
												  Vec4(p11.x(), p11.y(), 0.0f, 0.0f)));

	log << TestLog::Message << "Size: " << width << "x" << height << TestLog::EndMessage;
	log << TestLog::Message << "Format: " <<glu::getTextureFormatName(m_internalFormat) << TestLog::EndMessage;
	log << TestLog::Message << "Coords: " << p00 << ", " << p10 << ", " << p01 << ", " << p11 << TestLog::EndMessage;
	log << TestLog::Message << "Wrap: " << glu::getTextureWrapModeStr(m_wrapS) << " / " << glu::getTextureWrapModeStr(m_wrapT) << TestLog::EndMessage;
	log << TestLog::Message << "Filter: " << glu::getTextureFilterStr(m_minFilter) << " / " << glu::getTextureFilterStr(m_magFilter) << TestLog::EndMessage;
	log << TestLog::Message << "Mipmaps: " << (mipmaps ? "true" : "false") << TestLog::EndMessage;
	log << TestLog::Message << "Using additive blending." << TestLog::EndMessage;

	// Use same viewport size as texture size.
	setViewportSize(width, height);

	m_vertShaderSource =
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"in mediump vec2 a_coords;\n"
		"out mediump vec2 v_coords;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_coords = a_coords;\n"
		"}\n";

	std::ostringstream fragSrc;
	fragSrc << "#version 300 es\n";
	fragSrc << "layout(location = 0) out mediump vec4 o_color;\n";
	fragSrc << "in mediump vec2 v_coords;\n";

	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
		fragSrc << "uniform " << glu::getPrecisionName(samplerPrec) << " " << glu::getDataTypeName(samplerType) << " u_sampler" << texNdx << ";\n";

	fragSrc << "void main (void)\n"
			<< "{\n";

	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
	{
		if (texNdx == 0)
			fragSrc << "\t" << glu::getPrecisionName(samplerPrec) << " vec4 r = ";
		else
			fragSrc << "\tr += ";

		if (isIntUint)
			fragSrc << "vec4(";

		fragSrc << "texture(u_sampler" << texNdx << ", v_coords)";

		if (isIntUint)
			fragSrc << ")";

		fragSrc << ";\n";
	}

	fragSrc << "	o_color = r;\n"
			<< "}\n";

	m_fragShaderSource = fragSrc.str();

	m_textures.reserve(m_numTextures);
	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
	{
		static const IVec4 swizzles[] = { IVec4(0,1,2,3), IVec4(1,2,3,0), IVec4(2,3,0,1), IVec4(3,0,1,2),
										  IVec4(3,2,1,0), IVec4(2,1,0,3), IVec4(1,0,3,2), IVec4(0,3,2,1) };
		const IVec4& sw = swizzles[texNdx % DE_LENGTH_OF_ARRAY(swizzles)];

		glu::Texture2D* texture = new glu::Texture2D(m_renderCtx, m_internalFormat, width, height);
		m_textures.push_back(texture);

		// Fill levels.
		int numLevels = mipmaps ? texture->getRefTexture().getNumLevels() : 1;
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			// \todo [2013-06-02 pyry] Values are not scaled back to 0..1 range in shaders.
			texture->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithComponentGradients(texture->getRefTexture().getLevel(levelNdx),
											fmtInfo.valueMin.swizzle(sw[0], sw[1], sw[2], sw[3]),
											fmtInfo.valueMax.swizzle(sw[0], sw[1], sw[2], sw[3]));
		}

		texture->upload();
	}

	ShaderPerformanceCase::init();
}